

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_InvalidFileJavaStringCheckUtf8_Test::
FeaturesTest_InvalidFileJavaStringCheckUtf8_Test
          (FeaturesTest_InvalidFileJavaStringCheckUtf8_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_01884b50;
  DescriptorPool::DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_0187ef18;
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidFileJavaStringCheckUtf8) {
  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        options { java_string_check_utf8: true }
      )pb",
      "foo.proto: foo.proto: EDITIONS: File option java_string_check_utf8 is "
      "not allowed under editions. Use the (pb.java).utf8_validation feature "
      "to control this behavior.\n");
}